

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void __thiscall IVmBifTadsRNG::seed_int(IVmBifTadsRNG *this,int32_t i)

{
  size_t sVar1;
  char buf [40];
  
  buf._0_4_ = i;
  t3sprintf(buf + 4,0x24,"%ld");
  sVar1 = strlen(buf + 4);
  (*this->_vptr_IVmBifTadsRNG[5])(this,buf,sVar1 + 4);
  return;
}

Assistant:

virtual void seed_int(int32_t i)
    {
        /* by default, turn this into a string and seed with the string */
        char buf[40];
        oswp4(buf, i);
        t3sprintf(buf+4, sizeof(buf)-4, "%ld", (long)i);
        seed_str(buf, 4 + strlen(buf+4));
    }